

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  AbstractMajor *this;
  ostream *poVar2;
  CourseComponent *root;
  ShallowPrint *this_00;
  mapped_type *ppvVar3;
  reference ppCVar4;
  string major;
  string userInput;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  majorCourses;
  CatalogReader reader;
  
  major._M_dataplus._M_p = (pointer)&major.field_2;
  major._M_string_length = 0;
  major.field_2._M_local_buf[0] = '\0';
  majorCourses._M_h._M_buckets = &majorCourses._M_h._M_single_bucket;
  majorCourses._M_h._M_bucket_count = 1;
  majorCourses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  majorCourses._M_h._M_element_count = 0;
  majorCourses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  majorCourses._M_h._M_rehash_policy._M_next_resize = 0;
  majorCourses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::operator<<((ostream *)&std::cout,"Enter a major (ALL UPPERCASE): ");
  std::operator>>((istream *)&std::cin,(string *)&major);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar1 = std::operator==(&major,"BIOENGINEERING");
  if (!bVar1) {
    bVar1 = std::operator==(&major,"BIEN");
    if (!bVar1) {
      bVar1 = std::operator==(&major,"CHEMICAL ENGINEERING");
      if (!bVar1) {
        bVar1 = std::operator==(&major,"CHE");
        if (!bVar1) {
          bVar1 = std::operator==(&major,"COMPUTER ENGINEERING");
          if (!bVar1) {
            bVar1 = std::operator==(&major,"CEN");
            if (!bVar1) {
              bVar1 = std::operator==(&major,"COMPUTER SCINECE");
              if (!bVar1) {
                bVar1 = std::operator==(&major,"CS");
                if (!bVar1) {
                  bVar1 = std::operator==(&major,"COMPUTER SCIENCE WITH BUSINESS APPLICATIONS");
                  if (!bVar1) {
                    bVar1 = std::operator==(&major,"CSBA");
                    if (!bVar1) {
                      bVar1 = std::operator==(&major,"ELECTRICAL ENGINEERING");
                      if (!bVar1) {
                        bVar1 = std::operator==(&major,"EE");
                        if (!bVar1) {
                          bVar1 = std::operator==(&major,"ENVIRONMENTAL ENGINEERING");
                          if (!bVar1) {
                            bVar1 = std::operator==(&major,"ENVE");
                            if (!bVar1) {
                              bVar1 = std::operator==(&major,"MECHANICAL ENGINEERING");
                              if (!bVar1) {
                                bVar1 = std::operator==(&major,"ME");
                                if (!bVar1) {
                                  bVar1 = std::operator==(&major,"MATERIALS SCIENCE AND ENGINEERING"
                                                         );
                                  if (!bVar1) {
                                    bVar1 = std::operator==(&major,"MSE");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(&major,
                                                  "MATERIAL SCIENCE AND ENGINEERING");
                                      if (!bVar1) {
                                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                                 "Invalid major entered.");
                                        std::endl<char,std::char_traits<char>>(poVar2);
                                        exit(1);
                                      }
                                    }
                                  }
                                  this = (AbstractMajor *)operator_new(0x40);
                                  MaterialScience::MaterialScience((MaterialScience *)this);
                                  goto LAB_0010aab8;
                                }
                              }
                              this = (AbstractMajor *)operator_new(0x40);
                              MechanicalEngineering::MechanicalEngineering
                                        ((MechanicalEngineering *)this);
                              goto LAB_0010aab8;
                            }
                          }
                          this = (AbstractMajor *)operator_new(0x40);
                          EnvironmentalEngineering::EnvironmentalEngineering
                                    ((EnvironmentalEngineering *)this);
                          goto LAB_0010aab8;
                        }
                      }
                      this = (AbstractMajor *)operator_new(0x40);
                      ElectricalEngineering::ElectricalEngineering((ElectricalEngineering *)this);
                      goto LAB_0010aab8;
                    }
                  }
                  this = (AbstractMajor *)operator_new(0x40);
                  CSBusinessApplications::CSBusinessApplications((CSBusinessApplications *)this);
                  goto LAB_0010aab8;
                }
              }
              this = (AbstractMajor *)operator_new(0x40);
              ComputerScience::ComputerScience((ComputerScience *)this);
              goto LAB_0010aab8;
            }
          }
          this = (AbstractMajor *)operator_new(0x40);
          ComputerEngineering::ComputerEngineering((ComputerEngineering *)this);
          goto LAB_0010aab8;
        }
      }
      this = (AbstractMajor *)operator_new(0x40);
      ChemicalEngineering::ChemicalEngineering((ChemicalEngineering *)this);
      goto LAB_0010aab8;
    }
  }
  this = (AbstractMajor *)operator_new(0x40);
  Bioengineering::Bioengineering((Bioengineering *)this);
LAB_0010aab8:
  AbstractMajor::getRequirements(this);
  CatalogReader::CatalogReader(&reader,this);
  CatalogReader::setDebugOn(&reader,false);
  CatalogReader::createCourseHeirarchy_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
              *)&userInput,&reader);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&majorCourses._M_h,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&userInput);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&userInput);
  poVar2 = std::operator<<((ostream *)&std::cout,"Succesfully retreived heirarchy");
  std::endl<char,std::char_traits<char>>(poVar2);
  root = buildGraph(&majorCourses,false);
  poVar2 = std::operator<<((ostream *)&std::cout,"DISPLAYING COURSE TREE ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (ShallowPrint *)operator_new(8);
  (this_00->super_PrintAlgorithm)._vptr_PrintAlgorithm = (_func_int **)&PTR_print_00111d40;
  ShallowPrint::print(this_00,root);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Enter taken courses in the format of: \'CHEM 001A\'. Enter \'Q\' when done."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  userInput._M_dataplus._M_p = (pointer)&userInput.field_2;
  userInput._M_string_length = 0;
  userInput.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&userInput);
  while( true ) {
    bVar1 = std::operator!=(&userInput,"Q");
    if (!bVar1) break;
    std::operator>>((istream *)&std::cin,(string *)&userInput);
    ppvVar3 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&majorCourses,&userInput);
    ppCVar4 = std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::at(*ppvVar3,0);
    (*(root->super_Observer)._vptr_Observer[2])(root,*ppCVar4);
  }
  std::__cxx11::string::~string((string *)&userInput);
  CatalogReader::~CatalogReader(&reader);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&majorCourses._M_h);
  std::__cxx11::string::~string((string *)&major);
  return 0;
}

Assistant:

int main() {

    string major;
    CourseComponent* root;
    unordered_map<string, vector<CourseComponent*>*> majorCourses;
    PrintAlgorithm* printer;

    cout << "Enter a major (ALL UPPERCASE): ";
    cin >> major;
    cout << endl;

    // Convert user string to uppercase for simplicity purposes

    AbstractMajor* userMajor;
    if (major == "BIOENGINEERING" || major == "BIEN") {
        userMajor = new Bioengineering();
    }

    else if (major == "CHEMICAL ENGINEERING" || major == "CHE") {
        userMajor = new ChemicalEngineering();
    }

    else if (major == "COMPUTER ENGINEERING" || major == "CEN") {
        userMajor = new ComputerEngineering();
    }

    else if (major == "COMPUTER SCINECE" || major == "CS") {
        userMajor = new ComputerScience();
    }

    else if (major == "COMPUTER SCIENCE WITH BUSINESS APPLICATIONS" || major == "CSBA") {
        userMajor = new CSBusinessApplications();
    }

    else if (major == "ELECTRICAL ENGINEERING" || major == "EE") {
        userMajor = new ElectricalEngineering();
    }

    else if (major == "ENVIRONMENTAL ENGINEERING" || major == "ENVE") {
        userMajor = new EnvironmentalEngineering();
    }

    else if (major == "MECHANICAL ENGINEERING" || major == "ME") {
        userMajor = new MechanicalEngineering();
    }

    else if (major == "MATERIALS SCIENCE AND ENGINEERING" || major == "MSE" || major == "MATERIAL SCIENCE AND ENGINEERING") {
        userMajor = new MaterialScience();
    }

    // Program exits if the user inputs an invalid major
    else {
        cout << "Invalid major entered." << endl;
        exit(1);
    }

    userMajor->getRequirements();
    // Pass in the major to the CatalogReader
    CatalogReader reader(userMajor);

    reader.setDebugOn(false);
    // Returns unordered map of courses, stored by "name of course", <vector of linked courses and itself>
    majorCourses = reader.createCourseHeirarchy();
    cout << "Succesfully retreived heirarchy" << endl;
    root = buildGraph(majorCourses, false);


    cout << "DISPLAYING COURSE TREE " << endl;
    
    printer = new ShallowPrint();
    printer->print(root);

    cout << "Enter taken courses in the format of: 'CHEM 001A'. Enter 'Q' when done." << endl;
    string userInput;
    cin >> userInput;

    while (userInput != "Q") {
        cin >> userInput;
        root->remove(majorCourses.at(userInput)->at(0));
    }
}